

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printProblem.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *this;
  undefined8 in_RSI;
  undefined4 in_EDI;
  E *e;
  DecPOMDPDiscreteInterface *dpomdp;
  Arguments args;
  string local_280 [32];
  long *local_260;
  Arguments *in_stack_fffffffffffffdb0;
  Arguments local_248;
  undefined8 local_10;
  undefined4 local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  ArgumentHandlers::Arguments::Arguments(in_stack_fffffffffffffdb0);
  argp_parse(ArgumentHandlers::theArgpStruc,local_8,local_10,0,0,&local_248);
  local_260 = (long *)ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&local_248);
  (**(code **)(*(long *)((long)local_260 + *(long *)(*local_260 + -0xb8)) + 0x170))
            (local_280,(long)local_260 + *(long *)(*local_260 + -0xb8));
  this = std::operator<<((ostream *)&std::cout,local_280);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_280);
  ArgumentHandlers::Arguments::~Arguments((Arguments *)0x102f55);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    try
    {

    ArgumentHandlers::Arguments args;

    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    DecPOMDPDiscreteInterface* dpomdp = GetDecPOMDPDiscreteInterfaceFromArgs(args);
    cout << dpomdp->SoftPrint() << endl;

    }
    catch(E& e){ e.Print(); }

    return(0);
}